

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O0

size_t __thiscall CoreML::Specification::MILSpec::Operation::ByteSizeLong(Operation *this)

{
  bool bVar1;
  int iVar2;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>
  *pMVar3;
  const_pointer pvVar4;
  reference value;
  size_t sVar5;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
  *pMVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  const_pointer pvVar8;
  ulong uVar9;
  string *value_00;
  long lVar10;
  undefined1 local_c0 [4];
  int cached_size;
  undefined1 local_a8 [8];
  const_iterator it_1;
  Block *msg_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  RepeatedPtrField<CoreML::Specification::MILSpec::Block> *__range2_1;
  NamedValueType *msg;
  const_iterator __end2;
  const_iterator __begin2;
  RepeatedPtrField<CoreML::Specification::MILSpec::NamedValueType> *__range2;
  undefined1 local_38 [8];
  const_iterator it;
  size_t sStack_18;
  uint32_t cached_has_bits;
  size_t total_size;
  Operation *this_local;
  
  it.it_.bucket_index_._4_4_ = 0;
  iVar2 = _internal_inputs_size(this);
  sStack_18 = google::protobuf::internal::FromIntSize(iVar2);
  pMVar3 = _internal_inputs_abi_cxx11_(this);
  google::protobuf::
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>
  ::begin((const_iterator *)local_38,pMVar3);
  while( true ) {
    pMVar3 = _internal_inputs_abi_cxx11_(this);
    google::protobuf::
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>
    ::end((const_iterator *)&__range2,pMVar3);
    bVar1 = google::protobuf::operator!=((const_iterator *)local_38,(const_iterator *)&__range2);
    if (!bVar1) break;
    pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             google::protobuf::
             Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>
             ::const_iterator::operator->((const_iterator *)local_38);
    pvVar4 = google::protobuf::
             Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>
             ::const_iterator::operator->((const_iterator *)local_38);
    sVar5 = google::protobuf::internal::
            MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
            ::ByteSizeLong(pbVar7,(Argument *)(pvVar4 + 0x20));
    sStack_18 = sVar5 + sStack_18;
    google::protobuf::
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>
    ::const_iterator::operator++((const_iterator *)local_38);
  }
  iVar2 = _internal_outputs_size(this);
  sStack_18 = (long)iVar2 + sStack_18;
  __end2 = google::protobuf::RepeatedPtrField<CoreML::Specification::MILSpec::NamedValueType>::begin
                     (&this->outputs_);
  msg = (NamedValueType *)
        google::protobuf::RepeatedPtrField<CoreML::Specification::MILSpec::NamedValueType>::end
                  (&this->outputs_);
  while (bVar1 = google::protobuf::internal::
                 RepeatedPtrIterator<const_CoreML::Specification::MILSpec::NamedValueType>::
                 operator!=(&__end2,(iterator *)&msg), bVar1) {
    value = google::protobuf::internal::
            RepeatedPtrIterator<const_CoreML::Specification::MILSpec::NamedValueType>::operator*
                      (&__end2);
    sVar5 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::MILSpec::NamedValueType>(value);
    sStack_18 = sVar5 + sStack_18;
    google::protobuf::internal::
    RepeatedPtrIterator<const_CoreML::Specification::MILSpec::NamedValueType>::operator++(&__end2);
  }
  iVar2 = _internal_blocks_size(this);
  sStack_18 = (long)iVar2 + sStack_18;
  __end2_1 = google::protobuf::RepeatedPtrField<CoreML::Specification::MILSpec::Block>::begin
                       (&this->blocks_);
  msg_1 = (Block *)google::protobuf::RepeatedPtrField<CoreML::Specification::MILSpec::Block>::end
                             (&this->blocks_);
  while (bVar1 = google::protobuf::internal::
                 RepeatedPtrIterator<const_CoreML::Specification::MILSpec::Block>::operator!=
                           (&__end2_1,(iterator *)&msg_1), bVar1) {
    it_1.it_.bucket_index_ =
         (size_type)
         google::protobuf::internal::
         RepeatedPtrIterator<const_CoreML::Specification::MILSpec::Block>::operator*(&__end2_1);
    sVar5 = google::protobuf::internal::WireFormatLite::
            MessageSize<CoreML::Specification::MILSpec::Block>((Block *)it_1.it_.bucket_index_);
    sStack_18 = sVar5 + sStack_18;
    google::protobuf::internal::RepeatedPtrIterator<const_CoreML::Specification::MILSpec::Block>::
    operator++(&__end2_1);
  }
  iVar2 = _internal_attributes_size(this);
  sVar5 = google::protobuf::internal::FromIntSize(iVar2);
  sStack_18 = sVar5 + sStack_18;
  pMVar6 = _internal_attributes_abi_cxx11_(this);
  google::protobuf::
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
  ::begin((const_iterator *)local_a8,pMVar6);
  while( true ) {
    pMVar6 = _internal_attributes_abi_cxx11_(this);
    google::protobuf::
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
    ::end((const_iterator *)local_c0,pMVar6);
    bVar1 = google::protobuf::operator!=((const_iterator *)local_a8,(const_iterator *)local_c0);
    if (!bVar1) break;
    pbVar7 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             google::protobuf::
             Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
             ::const_iterator::operator->((const_iterator *)local_a8);
    pvVar8 = google::protobuf::
             Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
             ::const_iterator::operator->((const_iterator *)local_a8);
    sVar5 = google::protobuf::internal::
            MapEntryFuncs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
            ::ByteSizeLong(pbVar7,(Value *)(pvVar8 + 0x20));
    sStack_18 = sVar5 + sStack_18;
    google::protobuf::
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value>
    ::const_iterator::operator++((const_iterator *)local_a8);
  }
  _internal_type_abi_cxx11_(this);
  uVar9 = std::__cxx11::string::empty();
  if ((uVar9 & 1) == 0) {
    value_00 = _internal_type_abi_cxx11_(this);
    sVar5 = google::protobuf::internal::WireFormatLite::StringSize(value_00);
    sStack_18 = sVar5 + 1 + sStack_18;
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    lVar10 = std::__cxx11::string::size();
    sStack_18 = lVar10 + sStack_18;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(sStack_18);
  SetCachedSize(this,iVar2);
  return sStack_18;
}

Assistant:

size_t Operation::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.MILSpec.Operation)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // map<string, .CoreML.Specification.MILSpec.Argument> inputs = 2;
  total_size += 1 *
      ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(this->_internal_inputs_size());
  for (::PROTOBUF_NAMESPACE_ID::Map< std::string, ::CoreML::Specification::MILSpec::Argument >::const_iterator
      it = this->_internal_inputs().begin();
      it != this->_internal_inputs().end(); ++it) {
    total_size += Operation_InputsEntry_DoNotUse::Funcs::ByteSizeLong(it->first, it->second);
  }

  // repeated .CoreML.Specification.MILSpec.NamedValueType outputs = 3;
  total_size += 1UL * this->_internal_outputs_size();
  for (const auto& msg : this->outputs_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // repeated .CoreML.Specification.MILSpec.Block blocks = 4;
  total_size += 1UL * this->_internal_blocks_size();
  for (const auto& msg : this->blocks_) {
    total_size +=
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(msg);
  }

  // map<string, .CoreML.Specification.MILSpec.Value> attributes = 5;
  total_size += 1 *
      ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(this->_internal_attributes_size());
  for (::PROTOBUF_NAMESPACE_ID::Map< std::string, ::CoreML::Specification::MILSpec::Value >::const_iterator
      it = this->_internal_attributes().begin();
      it != this->_internal_attributes().end(); ++it) {
    total_size += Operation_AttributesEntry_DoNotUse::Funcs::ByteSizeLong(it->first, it->second);
  }

  // string type = 1;
  if (!this->_internal_type().empty()) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_type());
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}